

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void encode_cache_cpuid8000001d
               (CPUCacheInfo *cache,X86CPUTopoInfo *topo_info,uint32_t *eax,uint32_t *ebx,
               uint32_t *ecx,uint32_t *edx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  CacheType CVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = topo_info->nodes_per_pkg + (uint)(topo_info->nodes_per_pkg == 0);
  uVar4 = cache->line_size;
  bVar1 = cache->associativity;
  uVar6 = (uint)bVar1;
  bVar2 = cache->partitions;
  if (cache->size != uVar6 * uVar4 * (uint)bVar2 * cache->sets) {
    __assert_fail("cache->size == cache->line_size * cache->associativity * cache->partitions * cache->sets"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x146,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  CVar5 = cache->type;
  if (CVar5 == DATA_CACHE) {
    uVar8 = 1;
  }
  else if (CVar5 == INSTRUCTION_CACHE) {
    uVar8 = 2;
  }
  else {
    uVar8 = (uint)(CVar5 == UNIFIED_CACHE) * 3;
  }
  bVar3 = cache->level;
  uVar8 = (uint)cache->self_init << 8 | (uint)bVar3 << 5 | uVar8;
  *eax = uVar8;
  if (bVar3 == 3) {
    uVar7 = ((topo_info->cores_per_die * topo_info->dies_per_pkg * topo_info->threads_per_core +
             uVar7) - 1) / uVar7;
  }
  else {
    uVar7 = topo_info->threads_per_core;
  }
  *eax = (uVar7 * 0x4000 + uVar8) - 0x4000;
  if (uVar4 == 0) {
    __assert_fail("cache->line_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x156,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (bVar2 == 0) {
    __assert_fail("cache->partitions > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x157,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (bVar1 == 0) {
    __assert_fail("cache->associativity > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x158,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->sets <= uVar6) {
    __assert_fail("cache->associativity < cache->sets",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x15a,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  *ebx = uVar6 * 0x400000 - 0x400000 | uVar4 - 1 | (uint)bVar2 * 0x1000 - 0x1000;
  if (cache->sets == 0) {
    __assert_fail("cache->sets > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x15f,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  *ecx = cache->sets - 1;
  *edx = (uint)cache->no_invd_sharing + (uint)cache->inclusive * 2 +
         (uint)cache->complex_indexing * 4;
  return;
}

Assistant:

static void encode_cache_cpuid8000001d(CPUCacheInfo *cache,
                                       X86CPUTopoInfo *topo_info,
                                       uint32_t *eax, uint32_t *ebx,
                                       uint32_t *ecx, uint32_t *edx)
{
    uint32_t l3_cores;
    unsigned nodes = MAX(topo_info->nodes_per_pkg, 1);

    assert(cache->size == cache->line_size * cache->associativity *
                          cache->partitions * cache->sets);

    *eax = CACHE_TYPE(cache->type) | CACHE_LEVEL(cache->level) |
               (cache->self_init ? CACHE_SELF_INIT_LEVEL : 0);

    /* L3 is shared among multiple cores */
    if (cache->level == 3) {
        l3_cores = DIV_ROUND_UP((topo_info->dies_per_pkg *
                                 topo_info->cores_per_die *
                                 topo_info->threads_per_core),
                                 nodes);
        *eax |= (l3_cores - 1) << 14;
    } else {
        *eax |= ((topo_info->threads_per_core - 1) << 14);
    }

    assert(cache->line_size > 0);
    assert(cache->partitions > 0);
    assert(cache->associativity > 0);
    /* We don't implement fully-associative caches */
    assert(cache->associativity < cache->sets);
    *ebx = (cache->line_size - 1) |
           ((cache->partitions - 1) << 12) |
           ((cache->associativity - 1) << 22);

    assert(cache->sets > 0);
    *ecx = cache->sets - 1;

    *edx = (cache->no_invd_sharing ? CACHE_NO_INVD_SHARING : 0) |
           (cache->inclusive ? CACHE_INCLUSIVE : 0) |
           (cache->complex_indexing ? CACHE_COMPLEX_IDX : 0);
}